

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::LightNode> *node,ssize_t id)

{
  long lVar1;
  long *plVar2;
  undefined1 auVar3 [8];
  XMLWriter *this_00;
  runtime_error *this_01;
  long *in_RSI;
  undefined1 uVar4;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::QuadLight>_> light_6;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::TriangleLight>_> light_5;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::DistantLight>_> light_4;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>_> light_3;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::DirectionalLight>_> light_2;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>_> light_1;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>_> light;
  ssize_t in_stack_fffffffffffffcb0;
  AmbientLight *in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  long *local_330;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  PointLight *in_stack_fffffffffffffcf0;
  XMLWriter *in_stack_fffffffffffffcf8;
  long *local_2e0;
  long lVar5;
  QuadLight *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  DirectionalLight *in_stack_fffffffffffffd40;
  SpotLight *light_00;
  XMLWriter *in_stack_fffffffffffffd48;
  long *local_290;
  long *local_268;
  long *local_240;
  long *local_220;
  long *local_218;
  long *local_210;
  undefined1 local_208 [8];
  long *local_200;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1f8;
  undefined8 local_1e0 [5];
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_198;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_190;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_188;
  long **local_178;
  long **local_170;
  long **local_168;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  long **local_138;
  long **local_130;
  long **local_128;
  long **local_118;
  long **local_110;
  long **local_108;
  long **local_f8;
  long **local_f0;
  long **local_e8;
  long **local_e0;
  long **local_d0;
  long **local_c0;
  undefined1 *local_b0;
  long **local_a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_90;
  undefined8 *local_80;
  long *local_70;
  undefined8 *local_68;
  long *local_60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_58;
  long *local_50;
  long **local_48;
  XMLWriter *local_40;
  SpotLight *local_38;
  long *local_30;
  long **local_28;
  long *local_20;
  long **local_18;
  long *local_10;
  long **local_8;
  
  local_1b8 = local_1e0;
  if (*in_RSI == 0) {
    local_240 = (long *)0x0;
  }
  else {
    local_240 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::LightNode::typeinfo,
                                       &SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>
                                        ::typeinfo,0);
  }
  local_68 = local_1e0;
  local_70 = local_240;
  local_1e0[0] = local_240;
  if (local_240 != (long *)0x0) {
    (**(code **)(*local_240 + 0x10))();
  }
  local_1b0 = local_1e0;
  if ((long *)local_1e0[0] == (long *)0x0) {
    local_198 = &local_1f8;
    if (*in_RSI == 0) {
      local_268 = (long *)0x0;
    }
    else {
      local_268 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::LightNode::typeinfo,
                                         &SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>
                                          ::typeinfo,0);
    }
    local_58 = &local_1f8;
    local_60 = local_268;
    local_1f8._0_8_ = local_268;
    if (local_268 != (long *)0x0) {
      (**(code **)(*local_268 + 0x10))();
    }
    local_190 = &local_1f8;
    if ((long *)local_1f8._0_8_ == (long *)0x0) {
      local_178 = &local_200;
      if (*in_RSI == 0) {
        local_290 = (long *)0x0;
      }
      else {
        local_290 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::LightNode::typeinfo,
                                           &SceneGraph::
                                            LightNodeImpl<embree::SceneGraph::DirectionalLight>::
                                            typeinfo,0);
      }
      local_48 = &local_200;
      local_50 = local_290;
      local_200 = local_290;
      if (local_290 != (long *)0x0) {
        (**(code **)(*local_290 + 0x10))();
      }
      local_170 = &local_200;
      if (local_200 == (long *)0x0) {
        local_158 = local_208;
        if (*in_RSI == 0) {
          this_00 = (XMLWriter *)0x0;
        }
        else {
          this_00 = (XMLWriter *)
                    __dynamic_cast(*in_RSI,&SceneGraph::LightNode::typeinfo,
                                   &SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>::
                                    typeinfo,0);
        }
        light_00 = (SpotLight *)local_208;
        local_40 = this_00;
        local_38 = light_00;
        auVar3 = (undefined1  [8])this_00;
        if (this_00 != (XMLWriter *)0x0) {
          lVar5 = *(long *)local_208;
          local_208 = (undefined1  [8])this_00;
          (**(code **)(lVar5 + 0x10))();
          auVar3 = local_208;
        }
        local_208 = auVar3;
        local_150 = local_208;
        uVar4 = local_208 != (undefined1  [8])0x0;
        if ((bool)uVar4) {
          local_148 = local_208;
          store(this_00,light_00,CONCAT17(uVar4,in_stack_fffffffffffffd38));
        }
        else {
          local_138 = &local_210;
          lVar5 = *in_RSI;
          if (lVar5 == 0) {
            local_2e0 = (long *)0x0;
          }
          else {
            local_2e0 = (long *)__dynamic_cast(lVar5,&SceneGraph::LightNode::typeinfo,
                                               &SceneGraph::
                                                LightNodeImpl<embree::SceneGraph::DistantLight>::
                                                typeinfo,0);
          }
          local_28 = &local_210;
          local_30 = local_2e0;
          local_210 = local_2e0;
          if (local_2e0 != (long *)0x0) {
            (**(code **)(*local_2e0 + 0x10))();
          }
          local_130 = &local_210;
          if (local_210 == (long *)0x0) {
            local_118 = &local_218;
            if (*in_RSI == 0) {
              local_20 = (long *)0x0;
            }
            else {
              local_20 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::LightNode::typeinfo,
                                                &SceneGraph::
                                                 LightNodeImpl<embree::SceneGraph::TriangleLight>::
                                                 typeinfo,0);
            }
            local_18 = &local_218;
            plVar2 = local_20;
            if (local_20 != (long *)0x0) {
              lVar1 = *local_218;
              local_218 = local_20;
              (**(code **)(lVar1 + 0x10))();
              plVar2 = local_218;
            }
            local_218 = plVar2;
            local_110 = &local_218;
            if (local_218 == (long *)0x0) {
              local_f8 = &local_220;
              if (*in_RSI == 0) {
                local_330 = (long *)0x0;
              }
              else {
                local_330 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::LightNode::typeinfo,
                                                   &SceneGraph::
                                                    LightNodeImpl<embree::SceneGraph::QuadLight>::
                                                    typeinfo,0);
              }
              local_8 = &local_220;
              local_10 = local_330;
              local_220 = local_330;
              if (local_330 != (long *)0x0) {
                (**(code **)(*local_330 + 0x10))();
              }
              local_f0 = &local_220;
              if (local_220 == (long *)0x0) {
                this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_01,"unsupported light");
                __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              local_e8 = &local_220;
              store((XMLWriter *)CONCAT17(uVar4,in_stack_fffffffffffffd38),in_stack_fffffffffffffd30
                    ,lVar5);
              local_e0 = &local_220;
              if (local_220 != (long *)0x0) {
                (**(code **)(*local_220 + 0x18))();
              }
            }
            else {
              local_108 = &local_218;
              store((XMLWriter *)CONCAT17(uVar4,in_stack_fffffffffffffd38),
                    (TriangleLight *)in_stack_fffffffffffffd30,lVar5);
            }
            local_d0 = &local_218;
            if (local_218 != (long *)0x0) {
              (**(code **)(*local_218 + 0x18))();
            }
          }
          else {
            local_128 = &local_210;
            store(this_00,(DistantLight *)light_00,CONCAT17(uVar4,in_stack_fffffffffffffd38));
          }
          local_c0 = &local_210;
          if (local_210 != (long *)0x0) {
            (**(code **)(*local_210 + 0x18))();
          }
        }
        local_b0 = local_208;
        if (local_208 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_208 + 0x18))();
        }
      }
      else {
        local_168 = &local_200;
        store(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
              CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
      }
      local_a0 = &local_200;
      if (local_200 != (long *)0x0) {
        (**(code **)(*local_200 + 0x18))();
      }
    }
    else {
      local_188 = &local_1f8;
      store(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
            CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    }
    local_90 = &local_1f8;
    if ((long *)local_1f8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1f8._0_8_ + 0x18))();
    }
  }
  else {
    local_1a8 = local_1e0;
    store((XMLWriter *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
          in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  }
  local_80 = local_1e0;
  if ((long *)local_1e0[0] != (long *)0x0) {
    (**(code **)(*(long *)local_1e0[0] + 0x18))();
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::LightNode> node, ssize_t id)
  {
    if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::AmbientLight>>())
      store(light->light,id);
    else if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::PointLight>>())
      store(light->light,id);
    else if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::DirectionalLight>>())
      store(light->light,id);
    else if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::SpotLight>>())
      store(light->light,id);
    else if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::DistantLight>>())
      store(light->light,id);
    else if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::TriangleLight>>())
      store(light->light,id);
    else if (auto light = node.dynamicCast<SceneGraph::LightNodeImpl<SceneGraph::QuadLight>>())
      store(light->light,id);
    else
      throw std::runtime_error("unsupported light");
  }